

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O1

expression * cast_to(dmr_C *C,expression *old,symbol *type)

{
  int iVar1;
  position pVar2;
  bool bVar3;
  ulong uVar4;
  expression *peVar5;
  symbol *psVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  symbol *psVar13;
  int unaff_R12D;
  
  warn_for_different_enum_types(C,old->pos,old->ctype,type);
  psVar6 = old->ctype;
  if (psVar6 == &C->S->null_ctype) goto LAB_0010ec47;
  if (psVar6 == (symbol *)0x0) {
    uVar4 = 0;
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 | (psVar6->field_14).field_2.ctype.modifiers;
      uVar11 = *(uint *)((long)&psVar6->field_14 + 0x30) | uVar11;
      if (*(char *)psVar6 != '\x03') break;
      psVar6 = (psVar6->field_14).field_2.ctype.base_type;
    } while (psVar6 != (symbol *)0x0);
  }
  psVar13 = type;
  if (type == (symbol *)0x0) {
    uVar9 = 0;
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    uVar9 = 0;
    do {
      uVar9 = uVar9 | (psVar13->field_14).field_2.ctype.modifiers;
      uVar12 = *(uint *)((long)&psVar13->field_14 + 0x30) | uVar12;
      if (*(char *)psVar13 != '\x03') break;
      psVar13 = (psVar13->field_14).field_2.ctype.base_type;
    } while (psVar13 != (symbol *)0x0);
  }
  if ((psVar6 == psVar13) && (uVar11 == uVar12)) {
    uVar7 = (uVar9 ^ uVar4) & 0xffffffffad23fff0;
    if (uVar7 == 0) {
      unaff_R12D = 1;
      bVar3 = false;
    }
    else if (uVar7 == 0x10) {
      bVar3 = false;
      unaff_R12D = 0;
    }
    else {
      bVar3 = true;
    }
    if (bVar3) goto LAB_0010ebf0;
  }
  else {
LAB_0010ebf0:
    unaff_R12D = 0;
    if ((((uint)uVar9 | (uint)uVar4) >> 0x14 & 1) != 0) {
      pcVar10 = "to/from";
      if (((uint)uVar9 >> 0x14 & 1) == 0) {
        pcVar10 = "from";
      }
      pcVar8 = "to";
      if (((uint)uVar4 >> 0x14 & 1) != 0) {
        pcVar8 = pcVar10;
      }
      unaff_R12D = 0;
      dmrC_warning(C,old->pos,"implicit cast %s nocast type",pcVar8);
    }
  }
  if (unaff_R12D != 0) {
    return old;
  }
LAB_0010ec47:
  if (*(char *)old == '\r') {
    warn_for_different_enum_types(C,old->pos,old->ctype,type);
    iVar1 = (type->field_14).field_1.normal;
    if (iVar1 <= (old->ctype->field_14).field_1.normal) {
      peVar5 = (old->field_5).field_6.right;
      if (((peVar5->ctype->field_14).field_1.normal == iVar1) &&
         (*(char *)((long)&type->field_14 + 0xc) == *(char *)((long)&peVar5->ctype->field_14 + 0xc))
         ) {
        bVar3 = false;
      }
      else if (*(char *)((long)&type->field_14 + 0xc) ==
               *(char *)((long)&old->ctype->field_14 + 0xc)) {
        old->ctype = type;
        (old->field_5).field_4.symbol = type;
        bVar3 = false;
        peVar5 = old;
      }
      else {
        bVar3 = true;
      }
      if (!bVar3) {
        return peVar5;
      }
    }
  }
  else if (((*(char *)old == '\t') &&
           ((type->field_14).field_1.normal <= (old->ctype->field_14).field_1.normal)) &&
          (old->op == 0x7e)) {
    old->ctype = type;
    peVar5 = cast_to(C,(old->field_5).field_3.unop,type);
    (old->field_5).field_3.unop = peVar5;
    return old;
  }
  pVar2 = old->pos;
  peVar5 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
  *(undefined1 *)peVar5 = 0xd;
  peVar5->pos = pVar2;
  *(ushort *)peVar5 = (ushort)(byte)old->field_0x1 << 8 | 0xd;
  peVar5->ctype = type;
  (peVar5->field_5).field_4.symbol = type;
  (peVar5->field_5).field_6.right = old;
  if (*(char *)type == '\x03') {
    type = (type->field_14).field_2.ctype.base_type;
  }
  if (type == &C->S->bool_ctype) {
    cast_to_bool(C,peVar5);
  }
  return peVar5;
}

Assistant:

static struct expression * cast_to(struct dmr_C *C, struct expression *old, struct symbol *type)
{
	struct expression *expr;

	warn_for_different_enum_types (C, old->pos, old->ctype, type);

	if (old->ctype != &C->S->null_ctype && is_same_type(C, old, type))
		return old;

	/*
	 * See if we can simplify the op. Move the cast down.
	 */
	switch (old->type) {
	case EXPR_PREOP:
		if (old->ctype->bit_size < type->bit_size)
			break;
		if (old->op == '~') {
			old->ctype = type;
			old->unop = cast_to(C, old->unop, type);
			return old;
		}
		break;

	case EXPR_IMPLIED_CAST:
		warn_for_different_enum_types(C, old->pos, old->ctype, type);

		if (old->ctype->bit_size >= type->bit_size) {
			struct expression *orig = old->cast_expression;
			if (same_cast_type(C, orig->ctype, type))
				return orig;
			if (old->ctype->bit_offset == type->bit_offset) {
				old->ctype = type;
				old->cast_type = type;
				return old;
			}
		}
		break;

	default:
		/* nothing */;
	}

	expr = dmrC_alloc_expression(C, old->pos, EXPR_IMPLIED_CAST);
	expr->flags = old->flags;
	expr->ctype = type;
	expr->cast_type = type;
	expr->cast_expression = old;

	if (dmrC_is_bool_type(C->S, type))
		cast_to_bool(C, expr);

	return expr;
}